

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushOverrideID(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  uint *puVar4;
  ImGuiContext *ctx;
  uint *__dest;
  int iVar5;
  int iVar6;
  
  pIVar3 = GImGui->CurrentWindow;
  iVar6 = (pIVar3->IDStack).Size;
  iVar2 = (pIVar3->IDStack).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
      puVar4 = (pIVar3->IDStack).Data;
      if (puVar4 != (uint *)0x0) {
        memcpy(__dest,puVar4,(long)(pIVar3->IDStack).Size << 2);
        puVar4 = (pIVar3->IDStack).Data;
        if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
      }
      (pIVar3->IDStack).Data = __dest;
      (pIVar3->IDStack).Capacity = iVar6;
    }
  }
  (pIVar3->IDStack).Data[(pIVar3->IDStack).Size] = id;
  (pIVar3->IDStack).Size = (pIVar3->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(id);
}